

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseImporter.cpp
# Opt level: O2

bool Assimp::BaseImporter::SearchFileHeaderForToken
               (IOSystem *pIOHandler,string *pFile,char **tokens,uint numTokens,uint searchBytes,
               bool tokensSol,bool noAlphaBeforeTokens)

{
  char *pcVar1;
  int iVar2;
  undefined4 extraout_var;
  _Head_base<0UL,_char_*,_false> __haystack;
  long lVar4;
  _Head_base<0UL,_char_*,_false> _Var5;
  size_t sVar6;
  _Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_> _Var7;
  Logger *this;
  bool bVar8;
  _Alloc_hider _Var9;
  size_t tokIdx;
  size_t sVar10;
  size_t i;
  long lVar11;
  ulong uVar12;
  unique_ptr<char[],_std::default_delete<char[]>_> _buffer;
  string token;
  char *local_1c8 [4];
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  long *plVar3;
  
  if (tokens == (char **)0x0) {
    __assert_fail("nullptr != tokens",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Common/BaseImporter.cpp"
                  ,0xb9,
                  "static bool Assimp::BaseImporter::SearchFileHeaderForToken(IOSystem *, const std::string &, const char **, unsigned int, unsigned int, bool, bool)"
                 );
  }
  if (numTokens == 0) {
    __assert_fail("0 != numTokens",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Common/BaseImporter.cpp"
                  ,0xba,
                  "static bool Assimp::BaseImporter::SearchFileHeaderForToken(IOSystem *, const std::string &, const char **, unsigned int, unsigned int, bool, bool)"
                 );
  }
  if (searchBytes == 0) {
    __assert_fail("0 != searchBytes",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Common/BaseImporter.cpp"
                  ,0xbb,
                  "static bool Assimp::BaseImporter::SearchFileHeaderForToken(IOSystem *, const std::string &, const char **, unsigned int, unsigned int, bool, bool)"
                 );
  }
  if (pIOHandler != (IOSystem *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a8,"rb",(allocator<char> *)&token);
    iVar2 = (*pIOHandler->_vptr_IOSystem[4])(pIOHandler,(pFile->_M_dataplus)._M_p,local_1a8._0_8_);
    plVar3 = (long *)CONCAT44(extraout_var,iVar2);
    std::__cxx11::string::~string((string *)&local_1a8);
    if (plVar3 != (long *)0x0) {
      __haystack._M_head_impl = (char *)operator_new__((ulong)(searchBytes + 1));
      _buffer._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
      super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
      super__Head_base<0UL,_char_*,_false>._M_head_impl =
           (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
           (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)__haystack._M_head_impl;
      lVar4 = (**(code **)(*plVar3 + 0x10))(plVar3,__haystack._M_head_impl,1);
      if (lVar4 == 0) {
        std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr(&_buffer);
        bVar8 = false;
      }
      else {
        for (lVar11 = 0; lVar4 != lVar11; lVar11 = lVar11 + 1) {
          iVar2 = tolower((int)__haystack._M_head_impl[lVar11]);
          __haystack._M_head_impl[lVar11] = (char)iVar2;
        }
        _Var5._M_head_impl = __haystack._M_head_impl;
        for (lVar11 = 0; lVar4 != lVar11; lVar11 = lVar11 + 1) {
          if (__haystack._M_head_impl[lVar11] != '\0') {
            *_Var5._M_head_impl = __haystack._M_head_impl[lVar11];
            _Var5._M_head_impl = _Var5._M_head_impl + 1;
          }
        }
        *_Var5._M_head_impl = '\0';
        _Var9._M_p = (pointer)&token.field_2;
        token._M_string_length = 0;
        token.field_2._M_local_buf[0] = '\0';
        token._M_dataplus._M_p = _Var9._M_p;
        for (uVar12 = 0; uVar12 != numTokens; uVar12 = uVar12 + 1) {
          if (tokens[uVar12] == (char *)0x0) {
            __assert_fail("nullptr != tokens[i]",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Common/BaseImporter.cpp"
                          ,0xdc,
                          "static bool Assimp::BaseImporter::SearchFileHeaderForToken(IOSystem *, const std::string &, const char **, unsigned int, unsigned int, bool, bool)"
                         );
          }
          sVar6 = strlen(tokens[uVar12]);
          token._M_string_length = 0;
          *_Var9._M_p = '\0';
          pcVar1 = tokens[uVar12];
          for (sVar10 = 0; _Var9._M_p = token._M_dataplus._M_p, sVar6 != sVar10; sVar10 = sVar10 + 1
              ) {
            tolower((int)pcVar1[sVar10]);
            std::__cxx11::string::push_back((char)&token);
          }
          _Var7.super__Head_base<0UL,_char_*,_false>._M_head_impl =
               (_Head_base<0UL,_char_*,_false>)
               strstr(__haystack._M_head_impl,token._M_dataplus._M_p);
          if (((_Var7.super__Head_base<0UL,_char_*,_false>._M_head_impl != (char *)0x0) &&
              ((_Var7.super__Head_base<0UL,_char_*,_false>._M_head_impl ==
                (_Head_base<0UL,_char_*,_false>)__haystack._M_head_impl || !noAlphaBeforeTokens ||
               (iVar2 = isalpha((int)*(char *)((long)_Var7.super__Head_base<0UL,_char_*,_false>.
                                                     _M_head_impl + -1)), iVar2 == 0)))) &&
             ((_Var7.super__Head_base<0UL,_char_*,_false>._M_head_impl ==
               (_Head_base<0UL,_char_*,_false>)__haystack._M_head_impl || !tokensSol ||
              ((*(char *)((long)_Var7.super__Head_base<0UL,_char_*,_false>._M_head_impl + -1) ==
                '\r' || (*(char *)((long)_Var7.super__Head_base<0UL,_char_*,_false>._M_head_impl +
                                  -1) == '\n')))))) {
            this = DefaultLogger::get();
            Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
            basic_formatter<char[42]>
                      (&local_1a8,(char (*) [42])"Found positive match for header keyword: ");
            Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                      ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                       &local_1a8,tokens + uVar12);
            std::__cxx11::stringbuf::str();
            Logger::debug(this,local_1c8[0]);
            std::__cxx11::string::~string((string *)local_1c8);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
            std::__cxx11::string::~string((string *)&token);
            std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr(&_buffer);
            bVar8 = true;
            goto LAB_003a54aa;
          }
        }
        std::__cxx11::string::~string((string *)&token);
        std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr(&_buffer);
        bVar8 = false;
      }
LAB_003a54aa:
      (**(code **)(*plVar3 + 8))(plVar3);
      return bVar8;
    }
  }
  return false;
}

Assistant:

bool BaseImporter::SearchFileHeaderForToken( IOSystem* pIOHandler,
    const std::string&  pFile,
    const char**        tokens,
    unsigned int        numTokens,
    unsigned int        searchBytes /* = 200 */,
    bool                tokensSol /* false */,
    bool                noAlphaBeforeTokens /* false */)
{
    ai_assert( nullptr != tokens );
    ai_assert( 0 != numTokens );
    ai_assert( 0 != searchBytes);

    if ( nullptr == pIOHandler ) {
        return false;
    }

    std::unique_ptr<IOStream> pStream (pIOHandler->Open(pFile));
    if (pStream.get() ) {
        // read 200 characters from the file
        std::unique_ptr<char[]> _buffer (new char[searchBytes+1 /* for the '\0' */]);
        char *buffer( _buffer.get() );
        const size_t read( pStream->Read(buffer,1,searchBytes) );
        if( 0 == read ) {
            return false;
        }

        for( size_t i = 0; i < read; ++i ) {
            buffer[ i ] = static_cast<char>( ::tolower( buffer[ i ] ) );
        }

        // It is not a proper handling of unicode files here ...
        // ehm ... but it works in most cases.
        char* cur = buffer,*cur2 = buffer,*end = &buffer[read];
        while (cur != end)  {
            if( *cur ) {
                *cur2++ = *cur;
            }
            ++cur;
        }
        *cur2 = '\0';

        std::string token;
        for (unsigned int i = 0; i < numTokens; ++i ) {
            ai_assert( nullptr != tokens[i] );
            const size_t len( strlen( tokens[ i ] ) );
            token.clear();
            const char *ptr( tokens[ i ] );
            for ( size_t tokIdx = 0; tokIdx < len; ++tokIdx ) {
                token.push_back( static_cast<char>( tolower( *ptr ) ) );
                ++ptr;
            }
            const char* r = strstr( buffer, token.c_str() );
            if( !r ) {
                continue;
            }
            // We need to make sure that we didn't accidentially identify the end of another token as our token,
            // e.g. in a previous version the "gltf " present in some gltf files was detected as "f "
            if (noAlphaBeforeTokens && (r != buffer && isalpha(r[-1]))) {
                continue;
            }
            // We got a match, either we don't care where it is, or it happens to
            // be in the beginning of the file / line
            if (!tokensSol || r == buffer || r[-1] == '\r' || r[-1] == '\n') {
                ASSIMP_LOG_DEBUG_F( "Found positive match for header keyword: ", tokens[i] );
                return true;
            }
        }
    }

    return false;
}